

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateMembers
          (PrimitiveFieldGenerator *this,Printer *printer,bool lazy_init)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  const_iterator cVar1;
  char *text;
  allocator<char> local_51;
  key_type local_50;
  
  this_00 = &this->variables_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"default_constant",&local_51);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->variables_)._M_t._M_impl.super__Rb_tree_header) {
    text = "private static final $type$ $default_constant$ =\n    $default_constant_value$;\n";
    if (lazy_init) {
      text = "private static $type$ $default_constant$;\n";
    }
    io::Printer::Print(printer,this_00,text);
  }
  io::Printer::Print(printer,this_00,"public $type$ $name$;\n");
  if (((this->super_FieldGenerator).params_)->generate_has_ == true) {
    io::Printer::Print(printer,this_00,"public boolean has$capitalized_name$;\n");
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateMembers(io::Printer* printer, bool lazy_init) const {
  if (variables_.find("default_constant") != variables_.end()) {
    // Those primitive types that need a saved default.
    if (lazy_init) {
      printer->Print(variables_,
        "private static $type$ $default_constant$;\n");
    } else {
      printer->Print(variables_,
        "private static final $type$ $default_constant$ =\n"
        "    $default_constant_value$;\n");
    }
  }

  printer->Print(variables_,
    "public $type$ $name$;\n");

  if (params_.generate_has()) {
    printer->Print(variables_,
      "public boolean has$capitalized_name$;\n");
  }
}